

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_14174cb::SADx4Test_MaxRef_Test::TestBody(SADx4Test_MaxRef_Test *this)

{
  uint8_t *puVar1;
  long in_RDI;
  SADx4Test *in_stack_00000040;
  
  SADTestBase::FillConstant
            ((SADTestBase *)(in_RDI + 8),(anonymous_namespace)::SADTestBase::source_data_,
             *(int *)(in_RDI + 0x2c),0);
  puVar1 = (uint8_t *)(**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI + 8,0);
  SADTestBase::FillConstant
            ((SADTestBase *)(in_RDI + 8),puVar1,*(int *)(in_RDI + 0x34),
             (uint16_t)*(undefined4 *)(in_RDI + 0x20));
  puVar1 = (uint8_t *)(**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI + 8,1);
  SADTestBase::FillConstant
            ((SADTestBase *)(in_RDI + 8),puVar1,*(int *)(in_RDI + 0x34),
             (uint16_t)*(undefined4 *)(in_RDI + 0x20));
  puVar1 = (uint8_t *)(**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI + 8,2);
  SADTestBase::FillConstant
            ((SADTestBase *)(in_RDI + 8),puVar1,*(int *)(in_RDI + 0x34),
             (uint16_t)*(undefined4 *)(in_RDI + 0x20));
  puVar1 = (uint8_t *)(**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI + 8,3);
  SADTestBase::FillConstant
            ((SADTestBase *)(in_RDI + 8),puVar1,*(int *)(in_RDI + 0x34),
             (uint16_t)*(undefined4 *)(in_RDI + 0x20));
  SADx4Test::CheckSADs(in_stack_00000040);
  return;
}

Assistant:

TEST_P(SADx4Test, MaxRef) {
  FillConstant(source_data_, source_stride_, 0);
  FillConstant(GetReference(0), reference_stride_, mask_);
  FillConstant(GetReference(1), reference_stride_, mask_);
  FillConstant(GetReference(2), reference_stride_, mask_);
  FillConstant(GetReference(3), reference_stride_, mask_);
  CheckSADs();
}